

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_edge.cpp
# Opt level: O2

void check_tris(tri_cc_t *te)

{
  uint uVar1;
  pointer piVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  runtime_error *this;
  pointer ptVar7;
  uint uVar8;
  bool bVar9;
  vector<int,_std::allocator<int>_> vert_tri_ct;
  allocator_type local_1d8 [32];
  stringstream ss;
  ostream local_1a8 [376];
  
  _ss = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&vert_tri_ct,
             (long)(int)((ulong)((long)(te->m_verts).super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)(te->m_verts).super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 2),
             (value_type_conflict2 *)&ss,local_1d8);
  ptVar7 = (te->m_tris).super__Vector_base<tri_cc_t::tri,_std::allocator<tri_cc_t::tri>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = ((long)(te->m_tris).super__Vector_base<tri_cc_t::tri,_std::allocator<tri_cc_t::tri>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)ptVar7) / 0xc;
  while (bVar9 = lVar5 != 0, lVar5 = lVar5 + -1, bVar9) {
    vert_tri_ct.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[ptVar7->v] =
         vert_tri_ct.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[ptVar7->v] + 1;
    ptVar7 = ptVar7 + 1;
  }
  lVar5 = 0;
  do {
    piVar2 = (te->m_verts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(te->m_verts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar2) >> 2) <= lVar5) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&vert_tri_ct.super__Vector_base<int,_std::allocator<int>_>);
      return;
    }
    uVar1 = piVar2[lVar5];
    uVar8 = uVar1;
    iVar3 = 1;
    do {
      iVar4 = iVar3;
      uVar8 = (uVar8 + 2) % 3 + (uVar8 - uVar8 % 3);
      bVar9 = tri_cc_t::has_fnext(te,uVar8);
      if (!bVar9) break;
      uVar8 = tri_cc_t::fnext(te,uVar8);
      iVar3 = iVar4 + 1;
    } while (uVar8 != uVar1);
    if (vert_tri_ct.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar5] != iVar4) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar6 = std::operator<<(local_1a8,"Failed to ensure condition ");
      poVar6 = std::operator<<(poVar6,"t_no == vert_tri_ct[i]");
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"at (");
      poVar6 = std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/tri_edge.cpp"
                              );
      poVar6 = std::operator<<(poVar6,",");
      poVar6 = std::operator<<(poVar6,"check_tris");
      poVar6 = std::operator<<(poVar6,",");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2c9);
      poVar6 = std::operator<<(poVar6,") \n ");
      poVar6 = std::operator<<(poVar6,"Non manifold vertex found");
      poVar6 = std::operator<<(poVar6,"i");
      poVar6 = std::operator<<(poVar6," = ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)lVar5);
      std::endl<char,std::char_traits<char>>(poVar6);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this,(string *)local_1d8);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void check_tris(const tri_cc_t &te)
{
  vector<int> vert_tri_ct(te.vert_ct(),0);

  for( int i = 0 ; i < te.m_tris.size(); ++i)
  {
    vert_tri_ct[te.m_tris[i].v]++;
  }

  for( int i = 0 ; i < te.vert_ct(); ++i)
  {
    int tstart = te.m_verts[i],t = tstart,t_no = 0;

    do
    {
      t_no++;
      t = eprev(t);
      if (!te.has_fnext(t)) break;
      t = te.fnext(t);
    } while(t != tstart);

    ENSURES(t_no == vert_tri_ct[i])
        << "Non manifold vertex found"
        << STRMVAR(i)
        << endl;
  }
}